

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int tinsert(lua_State *L)

{
  int n;
  int iVar1;
  int iVar2;
  size_t sVar3;
  lua_Integer lVar4;
  lua_State *in_RDI;
  int i;
  int pos;
  int e;
  int in_stack_ffffffffffffffd8;
  int narg;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  narg = 1;
  luaL_checktype((lua_State *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),1,
                 in_stack_ffffffffffffffd8);
  sVar3 = lua_objlen((lua_State *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (int)((ulong)in_RDI >> 0x20));
  n = (int)sVar3 + 1;
  iVar1 = lua_gettop(in_RDI);
  iVar2 = n;
  if (iVar1 != 2) {
    if (iVar1 != 3) {
      iVar2 = luaL_error(in_RDI,"wrong number of arguments to \'insert\'");
      return iVar2;
    }
    iVar1 = n;
    lVar4 = luaL_checkinteger((lua_State *)CONCAT44(in_stack_ffffffffffffffe4,3),narg);
    n = (int)lVar4;
    iVar2 = iVar1;
    if (iVar1 < n) {
      iVar1 = n;
      iVar2 = n;
    }
    for (; n < iVar1; iVar1 = iVar1 + -1) {
      lua_rawgeti(in_RDI,iVar2,n);
      lua_rawseti(in_RDI,iVar2,n);
    }
  }
  lua_rawseti(in_RDI,iVar2,n);
  return 0;
}

Assistant:

static int tinsert(lua_State*L){
int e=aux_getn(L,1)+1;
int pos;
switch(lua_gettop(L)){
case 2:{
pos=e;
break;
}
case 3:{
int i;
pos=luaL_checkint(L,2);
if(pos>e)e=pos;
for(i=e;i>pos;i--){
lua_rawgeti(L,1,i-1);
lua_rawseti(L,1,i);
}
break;
}
default:{
return luaL_error(L,"wrong number of arguments to "LUA_QL("insert"));
}
}
luaL_setn(L,1,e);
lua_rawseti(L,1,pos);
return 0;
}